

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O2

elem * __thiscall cilkred_map::lookup(cilkred_map *this,void *key)

{
  bucket **ppbVar1;
  size_t sVar2;
  elem *peVar3;
  
  ppbVar1 = this->buckets;
  sVar2 = hashfun(this,key);
  if (ppbVar1[sVar2] != (bucket *)0x0) {
    for (peVar3 = ppbVar1[sVar2]->el; peVar3->key != (void *)0x0; peVar3 = peVar3 + 1) {
      if (peVar3->key == key) {
        if (peVar3->view != (void *)0x0) {
          return peVar3;
        }
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                      ,0x20a,"el->view");
      }
    }
  }
  return (elem *)0x0;
}

Assistant:

elem *cilkred_map::lookup(void *key)
{
    bucket *b = buckets[hashfun(this, key)];

    if (b) {
        elem *el;
        for (el = b->el; el->key; ++el) {
            if (el->key == key) {
                CILK_ASSERT(el->view);
                return el;
            }
        }
    }

    return 0;
}